

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O1

void __thiscall
MarkdownHighlighter::highlightFrontmatterBlock(MarkdownHighlighter *this,QString *text)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  QStringView QVar4;
  QLatin1String QVar5;
  HighlighterState local_48;
  undefined4 uStack_44;
  int local_40;
  long local_38;
  int local_30;
  
  iVar3 = (int)this;
  if (((text->d).size == 3) &&
     (QVar4.m_data = (text->d).ptr, QVar4.m_size = 3, QVar5.m_data = "---", QVar5.m_size = 3,
     iVar2 = QtPrivate::compareStrings(QVar4,QVar5,CaseSensitive), iVar2 == 0)) {
    iVar2 = QSyntaxHighlighter::previousBlockState();
    if (iVar2 != 0x1b) {
      QSyntaxHighlighter::document();
      QTextDocument::firstBlock();
      QSyntaxHighlighter::currentBlock();
      if (CONCAT44(uStack_44,local_48) != local_38) {
        return;
      }
      if (local_40 != local_30) {
        return;
      }
    }
    QSyntaxHighlighter::setCurrentBlockState(iVar3);
    local_48 = MaskedSyntax;
    QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[](&_formats,&local_48);
    uVar1 = (uint)(text->d).size;
  }
  else {
    iVar2 = QSyntaxHighlighter::previousBlockState();
    if (iVar2 != 0x1b) {
      return;
    }
    QSyntaxHighlighter::setCurrentBlockState(iVar3);
    uVar1 = (uint)(text->d).size;
    local_48 = MaskedSyntax;
    QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[](&_formats,&local_48);
  }
  QSyntaxHighlighter::setFormat(iVar3,0,(QTextCharFormat *)(ulong)uVar1);
  return;
}

Assistant:

void MarkdownHighlighter::highlightFrontmatterBlock(const QString &text) {
    if (text == QLatin1String("---")) {
        const bool foundEnd =
            previousBlockState() == HighlighterState::FrontmatterBlock;

        // return if the frontmatter block was already highlighted in previous
        // blocks, there just can be one frontmatter block
        if (!foundEnd && document()->firstBlock() != currentBlock()) {
            return;
        }

        setCurrentBlockState(foundEnd ? HighlighterState::FrontmatterBlockEnd
                                      : HighlighterState::FrontmatterBlock);

        QTextCharFormat &maskedFormat =
            _formats[HighlighterState::MaskedSyntax];
        setFormat(0, text.length(), maskedFormat);
    } else if (previousBlockState() == HighlighterState::FrontmatterBlock) {
        setCurrentBlockState(HighlighterState::FrontmatterBlock);
        setFormat(0, text.length(), _formats[HighlighterState::MaskedSyntax]);
    }
}